

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O0

json_string * __thiscall
NumberToString::_ftoa_abi_cxx11_
          (json_string *__return_storage_ptr__,NumberToString *this,json_number value)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  bool local_8d;
  allocator local_79;
  char *local_78;
  char *runner;
  char *pos;
  char num_str_result [64];
  double local_20;
  json_number local_18;
  json_number value_local;
  
  local_8d = false;
  local_18 = value;
  value_local = (json_number)__return_storage_ptr__;
  if (0.0 <= value) {
    uVar4 = (long)value | (long)(value - 9.223372036854776e+18) & (long)value >> 0x3f;
    auVar5._8_4_ = (int)(uVar4 >> 0x20);
    auVar5._0_8_ = uVar4;
    auVar5._12_4_ = 0x45300000;
    local_20 = (auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    local_8d = _floatsAreEqual(&local_18,&local_20);
  }
  if (local_8d != false) {
    _uitoa<unsigned_long>
              (__return_storage_ptr__,
               (long)local_18 | (long)(local_18 - 9.223372036854776e+18) & (long)local_18 >> 0x3f);
    return __return_storage_ptr__;
  }
  num_str_result._56_8_ = (undefined8)(long)local_18;
  bVar3 = _floatsAreEqual(&local_18,(json_number *)(num_str_result + 0x38));
  if (bVar3) {
    _itoa<long>(__return_storage_ptr__,(long)local_18);
    return __return_storage_ptr__;
  }
  snprintf((char *)&pos,0x3f,"%f",local_18);
  for (runner = (char *)&pos; *runner != '\0'; runner = runner + 1) {
    pcVar2 = runner;
    if (*runner == '.') goto LAB_001ec72e;
  }
LAB_001ec778:
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&pos,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return __return_storage_ptr__;
LAB_001ec72e:
  while (pcVar1 = pcVar2, local_78 = pcVar1 + 1, *local_78 != '\0') {
    pcVar2 = local_78;
    if (*local_78 != '0') {
      runner = pcVar1 + 2;
      pcVar2 = local_78;
    }
  }
  *runner = '\0';
  goto LAB_001ec778;
}

Assistant:

static json_string _ftoa(json_number value) json_nothrow {
	   #ifndef JSON_LIBRARY
			//ScopeCoverage(_ftoa_coverage, 6);
		  if (json_unlikely(value >= 0.0 && _floatsAreEqual(value, (json_number)((unsigned EXTRA_LONG long)value)))){
			 return _uitoa<unsigned EXTRA_LONG long>((unsigned EXTRA_LONG long)value);
		  } else
		#else
			  //ScopeCoverage(_ftoa_coverage, 5);
	   #endif
		  if (json_unlikely(_floatsAreEqual(value, (json_number)((long EXTRA_LONG)value)))){
			 return _itoa<long EXTRA_LONG>((long EXTRA_LONG)value);
		  }

	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(64);
	   #else
		  json_char num_str_result[64];
	   #endif
	   #ifdef JSON_UNICODE
		  std::swprintf(num_str_result, 63, LFLOAT_STRING, (EXTRA_LONG double)value);
	   #else
		  //Thanks to Salvor Hardin for this Visual C++ fix
		  #ifdef _MSC_VER
			 _snprintf_s(num_str_result, 63, 63, FLOAT_STRING, (EXTRA_LONG double)value); //yes, 63 appears twice using _snprintf_s()
		  #else
			 snprintf(num_str_result, 63, FLOAT_STRING, (EXTRA_LONG double)value);
		  #endif
	   #endif
	   //strip the trailing zeros
	   for(json_char * pos = &num_str_result[0]; *pos; ++pos){
		  if (json_unlikely(*pos == '.')){  //only care about after the decimal
			 for(json_char * runner = pos + 1; *runner; ++runner){
				 if (json_likely(*runner != JSON_TEXT('0'))){
					 pos = runner + 1;  //have to go to the end 1.0001
				 }
			 }
			 *pos = JSON_TEXT('\0');
			 break;
		  }
	   }
	   return json_string(num_str_result);
    }